

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::SaveCache(cmake *this,string *path)

{
  char *pcVar1;
  char **ppcVar2;
  char **ppcVar3;
  allocator local_49;
  string local_48;
  char **local_28;
  char **nameIt;
  string *psStack_18;
  bool result;
  string *path_local;
  cmake *this_local;
  
  psStack_18 = path;
  path_local = (string *)this;
  nameIt._7_1_ = cmState::SaveCache(this->State,path);
  local_28 = cmArrayBegin<char_const*,4ul>(&SaveCache::entries);
  while( true ) {
    ppcVar2 = local_28;
    ppcVar3 = cmArrayEnd<char_const*,4ul>(&SaveCache::entries);
    if (ppcVar2 == ppcVar3) break;
    pcVar1 = *local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    UnwatchUnusedCli(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_28 = local_28 + 1;
  }
  return (bool)(nameIt._7_1_ & 1);
}

Assistant:

bool cmake::SaveCache(const std::string& path)
{
  bool result = this->State->SaveCache(path);
  static const char* entries[] = {"CMAKE_CACHE_MAJOR_VERSION",
                                  "CMAKE_CACHE_MINOR_VERSION",
                                  "CMAKE_CACHE_PATCH_VERSION",
                                  "CMAKE_CACHEFILE_DIR"};
  for (const char* const* nameIt = cmArrayBegin(entries);
       nameIt != cmArrayEnd(entries); ++nameIt)
    {
    this->UnwatchUnusedCli(*nameIt);
    }
  return result;
}